

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

bool wallet::IsDust(CRecipient *recipient,CFeeRate *dustRelayFee)

{
  CScript scriptPubKeyIn;
  bool bVar1;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0 [20];
  uint in_stack_ffffffffffffffb4;
  CTxOut local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&stack0xffffffffffffff98,&recipient->dest);
  scriptPubKeyIn.super_CScriptBase._union._8_20_ = in_stack_ffffffffffffffa0;
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_ffffffffffffff98;
  scriptPubKeyIn.super_CScriptBase._size = in_stack_ffffffffffffffb4;
  CTxOut::CTxOut(&local_48,&recipient->nAmount,scriptPubKeyIn);
  bVar1 = ::IsDust(&local_48,dustRelayFee);
  if (0x1c < local_48.scriptPubKey.super_CScriptBase._size) {
    free(local_48.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    local_48.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < in_stack_ffffffffffffffb4) {
    free((void *)in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool IsDust(const CRecipient& recipient, const CFeeRate& dustRelayFee)
{
    return ::IsDust(CTxOut(recipient.nAmount, GetScriptForDestination(recipient.dest)), dustRelayFee);
}